

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O0

int __thiscall
TPZPlane::SetPlane(TPZPlane *this,TPZVec<double> *p1,TPZVec<double> *p2,TPZVec<double> *p3)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *__last1;
  double *__first2;
  long lVar5;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  REAL RVar6;
  REAL RVar7;
  REAL sol [3];
  REAL matrix2 [3] [3];
  REAL vect [3];
  int ordem [3];
  REAL norm;
  int i;
  TPZVec<double> aux;
  TPZVec<double> desloc2;
  TPZVec<double> desloc1;
  REAL matrix [3] [3];
  REAL *in_stack_fffffffffffffd18;
  TPZVec<double> *in_stack_fffffffffffffd20;
  int *in_stack_fffffffffffffd38;
  TPZVec<double> *in_stack_fffffffffffffd40;
  TPZVec<double> *in_stack_fffffffffffffd50;
  TPZVec<double> *in_stack_fffffffffffffd58;
  TPZVec<double> *in_stack_fffffffffffffd60;
  double local_198 [2];
  _func_int **local_188;
  REAL local_178 [3];
  double adStack_160 [7];
  double local_128;
  double local_120;
  double local_118;
  int local_108;
  undefined4 local_fc;
  double local_f8;
  int local_ec;
  TPZVec<double> local_e8;
  TPZVec<double> local_b8;
  TPZVec<double> local_98;
  double local_78 [4];
  double local_58;
  double local_48;
  double local_40;
  TPZVec<double> *local_28;
  TPZVec<double> *local_20;
  TPZVec<double> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  TPZVec<double>::TPZVec(in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18);
  TPZVec<double>::TPZVec(in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18);
  TPZVec<double>::TPZVec(in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18);
  for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
    pdVar4 = TPZVec<double>::operator[](local_18,(long)local_ec);
    dVar2 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_20,(long)local_ec);
    dVar3 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_98,(long)local_ec);
    *pdVar4 = dVar2 - dVar3;
    pdVar4 = TPZVec<double>::operator[](local_20,(long)local_ec);
    dVar2 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_28,(long)local_ec);
    dVar3 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](&local_b8,(long)local_ec);
    *pdVar4 = dVar2 - dVar3;
  }
  TPZNumeric::ProdVetorial<double>
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  pdVar4 = TPZVec<double>::operator[](&local_e8,0);
  __last1 = TPZVec<double>::operator[](&local_e8,3);
  __first2 = TPZVec<double>::operator[](&local_e8,0);
  local_f8 = std::inner_product<double*,double*,double>(pdVar4,__last1,__first2,0.0);
  if (1e-10 < local_f8) {
    for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
      pdVar4 = TPZVec<double>::operator[](local_18,(long)(local_ec % 3));
      local_78[0] = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](local_18,(long)(local_ec + 1 + ((local_ec + 1) / 3) * -3))
      ;
      local_78[1] = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](local_20,(long)(local_ec % 3));
      local_78[3] = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](local_20,(long)(local_ec + 1 + ((local_ec + 1) / 3) * -3))
      ;
      local_58 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](local_28,(long)(local_ec % 3));
      local_48 = *pdVar4;
      pdVar4 = TPZVec<double>::operator[](local_28,(long)(local_ec + 1 + ((local_ec + 1) / 3) * -3))
      ;
      local_40 = *pdVar4;
      local_78[(long)local_ec * 3 + 2] = 1.0;
      TPZVec<double>::operator[](&local_e8,(long)local_ec);
      MatrixDet((REAL (*) [3])in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    TPZNumeric::SortArray3<double>(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    local_ec = local_108;
    pdVar4 = TPZVec<double>::operator[](local_18,(long)(local_108 % 3));
    local_78[0] = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_18,(long)(local_ec + 1 + ((local_ec + 1) / 3) * -3));
    local_78[1] = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_20,(long)(local_ec % 3));
    local_78[3] = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_20,(long)(local_ec + 1 + ((local_ec + 1) / 3) * -3));
    local_58 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_28,(long)(local_ec % 3));
    local_48 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_28,(long)(local_ec + 1 + ((local_ec + 1) / 3) * -3));
    local_40 = *pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_18,(long)(local_ec + 2 + ((local_ec + 2) / 3) * -3));
    local_128 = -*pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_20,(long)(local_ec + 2 + ((local_ec + 2) / 3) * -3));
    local_120 = -*pdVar4;
    pdVar4 = TPZVec<double>::operator[](local_20,(long)(local_ec + 2 + ((local_ec + 2) / 3) * -3));
    local_118 = -*pdVar4;
    for (local_ec = 0; local_ec < 3; local_ec = local_ec + 1) {
      local_178[local_ec % 3] = local_128;
      adStack_160[local_ec % 3] = local_120;
      adStack_160[(long)(local_ec % 3) + 3] = local_118;
      iVar1 = local_ec + 1 + ((local_ec + 1) / 3) * -3;
      local_178[iVar1] = local_78[iVar1];
      lVar5 = (long)(local_ec + 1 + ((local_ec + 1) / 3) * -3);
      adStack_160[lVar5] = local_78[lVar5 + 3];
      lVar5 = (long)(local_ec + 1 + ((local_ec + 1) / 3) * -3);
      adStack_160[lVar5 + 3] = local_78[lVar5 + 6];
      iVar1 = local_ec + 2 + ((local_ec + 2) / 3) * -3;
      local_178[iVar1] = local_78[iVar1];
      lVar5 = (long)(local_ec + 2 + ((local_ec + 2) / 3) * -3);
      adStack_160[lVar5] = local_78[lVar5 + 3];
      lVar5 = (long)(local_ec + 2 + ((local_ec + 2) / 3) * -3);
      adStack_160[lVar5 + 3] = local_78[lVar5 + 6];
      RVar6 = MatrixDet(&local_178);
      RVar7 = MatrixDet((REAL (*) [3])local_78);
      local_198[local_ec] = RVar6 / RVar7;
    }
    pdVar4 = TPZVec<double>::operator[](in_RDI,(long)(local_108 % 3));
    *pdVar4 = local_198[0];
    pdVar4 = TPZVec<double>::operator[](in_RDI,(long)(local_108 + 1 + ((local_108 + 1) / 3) * -3));
    *pdVar4 = local_198[1];
    pdVar4 = TPZVec<double>::operator[](in_RDI,(long)(local_108 + 2 + ((local_108 + 2) / 3) * -3));
    *pdVar4 = 1.0;
    in_stack_fffffffffffffd20 = (TPZVec<double> *)TPZVec<double>::operator[](in_RDI,3);
    in_stack_fffffffffffffd20->_vptr_TPZVec = local_188;
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "TPZPlane::SetPlane - Error: Colinear points can\'t define a single plane\n");
    local_4 = 0;
  }
  local_fc = 1;
  TPZVec<double>::~TPZVec(in_stack_fffffffffffffd20);
  TPZVec<double>::~TPZVec(in_stack_fffffffffffffd20);
  TPZVec<double>::~TPZVec(in_stack_fffffffffffffd20);
  return local_4;
}

Assistant:

int TPZPlane::SetPlane(const TPZVec<REAL> &p1, const TPZVec<REAL> &p2,const TPZVec<REAL> &p3){
	REAL matrix[3][3];
	TPZVec<REAL> desloc1(3), desloc2(3);
	TPZVec<REAL> aux(3);
	int i ;
	
	for(i=0; i<3;i++){
		desloc1[i] = p1[i]- p2[i];
		desloc2[i] = p2[i]-p3[i];
	}  
	TPZNumeric::ProdVetorial(desloc1, desloc2, aux);
	REAL norm = inner_product(&aux[0], &aux[3], &aux[0], REAL(0.0));
	if(norm <= 1e-10){
		cerr << "TPZPlane::SetPlane - Error: Colinear points can't define a single plane\n";
		return 0;
	}
	else{
		for(i=0; i<3;i++){
			matrix[0][0]=p1[i%3];
			matrix[0][1]=p1[(i+1)%3];
			matrix[1][0]=p2[i%3];
			matrix[1][1]=p2[(i+1)%3];
			matrix[2][0]=p3[i%3];
			matrix[2][1]=p3[(i+1)%3];
			matrix[i][2]=1.0;
			MatrixDet(matrix, aux[i]);
		}
		
		int ordem[3];
		REAL vect[3];
		TPZNumeric::SortArray3(aux,ordem);
		i=ordem[0];
		
		matrix[0][0]=p1[i%3];
		matrix[0][1]=p1[(i+1)%3];
		matrix[1][0]=p2[i%3];
		matrix[1][1]=p2[(i+1)%3];
		matrix[2][0]=p3[i%3];
		matrix[2][1]=p3[(i+1)%3];
		vect[0]=-p1[(i+2)%3];
		vect[1]=-p2[(i+2)%3];
		vect[2]=-p2[(i+2)%3];
		
		REAL matrix2[3][3];
		REAL sol[3];
		
		for(i=0; i<3;i++){
			matrix2[0][i%3]=vect[0];
			matrix2[1][i%3]=vect[1];
			matrix2[2][i%3]=vect[2];
			matrix2[0][(i+1)%3]=matrix[0][(i+1)%3];
			matrix2[1][(i+1)%3]=matrix[1][(i+1)%3];
			matrix2[2][(i+1)%3]=matrix[2][(i+1)%3];
			matrix2[0][(i+2)%3]=matrix[0][(i+2)%3];
			matrix2[1][(i+2)%3]=matrix[1][(i+2)%3];
			matrix2[2][(i+2)%3]=matrix[2][(i+2)%3];
			
			sol[i]=MatrixDet(matrix2)/MatrixDet(matrix);
		}
		fCoef[(ordem[0])%3]=sol[0];
		fCoef[(ordem[0]+1)%3]=sol[1];
		fCoef[(ordem[0]+2)%3]= 1.0;
		fCoef[3]=sol[2];
	}
	cout <<endl;
	return 1;	
}